

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeFunctor * __thiscall icu_63::UnicodeSet::cloneAsThawed(UnicodeSet *this)

{
  UnicodeSet *this_00;
  size_t in_RSI;
  
  this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,in_RSI);
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet(this_00,this,'\0');
  }
  return (UnicodeFunctor *)this_00;
}

Assistant:

UnicodeFunctor *UnicodeSet::cloneAsThawed() const {
    return new UnicodeSet(*this, TRUE);
}